

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::DriveCustomCommands
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  pointer ppcVar1;
  string *config;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  pointer ppcVar3;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  cmCustomCommandGenerator ccg;
  allocator<char> local_111;
  cmMakefileTargetGenerator *local_110;
  _Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_108;
  string *local_e8;
  string local_e0;
  cmCustomCommandGenerator local_c0;
  
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  this_01 = (this->super_cmCommonTargetGenerator).Makefile;
  local_110 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"CMAKE_BUILD_TYPE",&local_111);
  config = cmMakefile::GetSafeDefinition(this_01,(string *)&local_c0);
  cmGeneratorTarget::GetSourceFiles
            (this_00,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_108,config);
  std::__cxx11::string::~string((string *)&local_c0);
  ppcVar1 = local_108._M_impl.super__Vector_impl_data._M_finish;
  local_e8 = (string *)&(local_110->super_cmCommonTargetGenerator).ConfigName;
  for (ppcVar3 = local_108._M_impl.super__Vector_impl_data._M_start; ppcVar3 != ppcVar1;
      ppcVar3 = ppcVar3 + 1) {
    cc = cmSourceFile::GetCustomCommand(*ppcVar3);
    if (cc != (cmCustomCommand *)0x0) {
      std::__cxx11::string::string((string *)&local_e0,local_e8);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&local_c0,cc,&local_e0,(cmLocalGenerator *)local_110->LocalGenerator);
      std::__cxx11::string::~string((string *)&local_e0);
      pvVar2 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(&local_c0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)depends,
                 (depends->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 (pvVar2->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (pvVar2->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&local_c0);
    }
  }
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base(&local_108);
  return;
}

Assistant:

void cmMakefileTargetGenerator::DriveCustomCommands(
  std::vector<std::string>& depends)
{
  // Depend on all custom command outputs.
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(
    sources, this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
  for (cmSourceFile* source : sources) {
    if (cmCustomCommand* cc = source->GetCustomCommand()) {
      cmCustomCommandGenerator ccg(*cc, this->ConfigName,
                                   this->LocalGenerator);
      const std::vector<std::string>& outputs = ccg.GetOutputs();
      depends.insert(depends.end(), outputs.begin(), outputs.end());
    }
  }
}